

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::to_combined_image_sampler_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,VariableID image_id,VariableID samp_id)

{
  Parameter *pPVar1;
  SPIRFunction *pSVar2;
  Parameter *pPVar3;
  CombinedImageSamplerParameter *pCVar4;
  CombinedImageSampler *pCVar5;
  long lVar6;
  SPIRVariable *pSVar7;
  SPIRVariable *pSVar8;
  long *plVar9;
  runtime_error *prVar10;
  size_type *psVar11;
  Parameter *pPVar12;
  CombinedImageSamplerParameter *pCVar13;
  CombinedImageSampler *pCVar14;
  bool bVar15;
  size_t sVar16;
  ulong uVar17;
  Parameter *pPVar18;
  Parameter *pPVar19;
  size_t sVar20;
  long lVar21;
  bool bVar22;
  string array_expr;
  string image_expr;
  string local_90;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  string local_50;
  
  to_expression_abi_cxx11_(&local_50,this,image_id.id,true);
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = 0;
  lVar6 = ::std::__cxx11::string::find((char)&local_50,0x5b);
  if (lVar6 != -1) {
    ::std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_50);
    ::std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  pSVar2 = (this->super_Compiler).current_function;
  pSVar7 = Compiler::maybe_get_backing_variable(&this->super_Compiler,image_id.id);
  pSVar8 = Compiler::maybe_get_backing_variable(&this->super_Compiler,samp_id.id);
  if (pSVar7 != (SPIRVariable *)0x0) {
    image_id.id = (pSVar7->super_IVariant).self.id;
  }
  if (pSVar8 != (SPIRVariable *)0x0) {
    samp_id.id = (pSVar8->super_IVariant).self.id;
  }
  pPVar3 = (pSVar2->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
  sVar16 = (pSVar2->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
  pPVar1 = pPVar3 + sVar16;
  lVar6 = (long)sVar16 >> 2;
  pPVar18 = pPVar3;
  sVar20 = sVar16;
  if (0 < lVar6) {
    pPVar18 = pPVar3 + lVar6 * 4;
    lVar21 = lVar6 + 1;
    pPVar12 = pPVar3 + 2;
    do {
      if (pPVar12[-2].id.id == image_id.id) {
        pPVar12 = pPVar12 + -2;
        goto LAB_001c8cf9;
      }
      if (pPVar12[-1].id.id == image_id.id) {
        pPVar12 = pPVar12 + -1;
        goto LAB_001c8cf9;
      }
      if ((pPVar12->id).id == image_id.id) goto LAB_001c8cf9;
      if (pPVar12[1].id.id == image_id.id) {
        pPVar12 = pPVar12 + 1;
        goto LAB_001c8cf9;
      }
      lVar21 = lVar21 + -1;
      pPVar12 = pPVar12 + 4;
    } while (1 < lVar21);
    sVar20 = ((long)(sVar16 * 0x14 + lVar6 * -0x50) >> 2) * -0x3333333333333333;
  }
  if (sVar20 == 1) {
LAB_001c8ced:
    pPVar12 = pPVar18;
    if ((pPVar18->id).id != image_id.id) {
      pPVar12 = pPVar1;
    }
  }
  else {
    pPVar12 = pPVar18;
    if (sVar20 == 2) {
LAB_001c8ccc:
      if ((pPVar12->id).id != image_id.id) {
        pPVar18 = pPVar12 + 1;
        goto LAB_001c8ced;
      }
    }
    else {
      pPVar12 = pPVar1;
      if ((sVar20 == 3) && (pPVar12 = pPVar18, (pPVar18->id).id != image_id.id)) {
        pPVar12 = pPVar18 + 1;
        goto LAB_001c8ccc;
      }
    }
  }
LAB_001c8cf9:
  pPVar18 = pPVar3;
  if (0 < lVar6) {
    pPVar18 = pPVar3 + lVar6 * 4;
    lVar21 = lVar6 + 1;
    pPVar19 = pPVar3 + 2;
    do {
      if (pPVar19[-2].id.id == samp_id.id) {
        pPVar19 = pPVar19 + -2;
        goto LAB_001c8d9d;
      }
      if (pPVar19[-1].id.id == samp_id.id) {
        pPVar19 = pPVar19 + -1;
        goto LAB_001c8d9d;
      }
      if ((pPVar19->id).id == samp_id.id) goto LAB_001c8d9d;
      if (pPVar19[1].id.id == samp_id.id) {
        pPVar19 = pPVar19 + 1;
        goto LAB_001c8d9d;
      }
      lVar21 = lVar21 + -1;
      pPVar19 = pPVar19 + 4;
    } while (1 < lVar21);
    sVar16 = ((long)(sVar16 * 0x14 + lVar6 * -0x50) >> 2) * -0x3333333333333333;
  }
  if (sVar16 == 1) {
LAB_001c8d91:
    pPVar19 = pPVar18;
    if ((pPVar18->id).id != samp_id.id) {
      pPVar19 = pPVar1;
    }
  }
  else {
    pPVar19 = pPVar18;
    if (sVar16 == 2) {
LAB_001c8d70:
      if ((pPVar19->id).id != samp_id.id) {
        pPVar18 = pPVar19 + 1;
        goto LAB_001c8d91;
      }
    }
    else {
      pPVar19 = pPVar1;
      if ((sVar16 == 3) && (pPVar19 = pPVar18, (pPVar18->id).id != samp_id.id)) {
        pPVar19 = pPVar18 + 1;
        goto LAB_001c8d70;
      }
    }
  }
LAB_001c8d9d:
  if (pPVar12 == pPVar1) {
    if (pPVar19 == pPVar1) {
      pCVar5 = (this->super_Compiler).combined_image_samplers.
               super_VectorView<spirv_cross::CombinedImageSampler>.ptr;
      sVar16 = (this->super_Compiler).combined_image_samplers.
               super_VectorView<spirv_cross::CombinedImageSampler>.buffer_size;
      lVar6 = (long)sVar16 >> 2;
      pCVar14 = pCVar5;
      sVar20 = sVar16;
      if (0 < lVar6) {
        lVar21 = lVar6 + 1;
        pCVar14 = pCVar5 + 2;
        do {
          if ((pCVar14[-2].image_id.id == image_id.id) && (pCVar14[-2].sampler_id.id == samp_id.id))
          {
            pCVar14 = pCVar14 + -2;
            goto LAB_001c90f9;
          }
          if ((pCVar14[-1].image_id.id == image_id.id) && (pCVar14[-1].sampler_id.id == samp_id.id))
          {
            pCVar14 = pCVar14 + -1;
            goto LAB_001c90f9;
          }
          if (((pCVar14->image_id).id == image_id.id) && ((pCVar14->sampler_id).id == samp_id.id))
          goto LAB_001c90f9;
          if ((pCVar14[1].image_id.id == image_id.id) && (pCVar14[1].sampler_id.id == samp_id.id)) {
            pCVar14 = pCVar14 + 1;
            goto LAB_001c90f9;
          }
          lVar21 = lVar21 + -1;
          pCVar14 = pCVar14 + 4;
        } while (1 < lVar21);
        sVar20 = ((long)(sVar16 * 0xc + lVar6 * -0x30) >> 2) * -0x5555555555555555;
        pCVar14 = pCVar5 + lVar6 * 4;
      }
      if (sVar20 == 1) {
LAB_001c8ffc:
        if (((pCVar14->image_id).id != image_id.id) || ((pCVar14->sampler_id).id != samp_id.id))
        goto LAB_001c9194;
      }
      else if (sVar20 == 2) {
LAB_001c8fe9:
        if (((pCVar14->image_id).id != image_id.id) || ((pCVar14->sampler_id).id != samp_id.id)) {
          pCVar14 = pCVar14 + 1;
          goto LAB_001c8ffc;
        }
      }
      else {
        if (sVar20 != 3) goto LAB_001c9194;
        if (((pCVar14->image_id).id != image_id.id) || ((pCVar14->sampler_id).id != samp_id.id)) {
          pCVar14 = pCVar14 + 1;
          goto LAB_001c8fe9;
        }
      }
LAB_001c90f9:
      if (pCVar14 == pCVar5 + sVar16) {
LAB_001c9194:
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,
                   "Cannot find mapping for combined sampler, was build_combined_image_samplers() used before compile() was called?"
                   ,"");
        ::std::runtime_error::runtime_error(prVar10,(string *)&local_90);
        *(undefined ***)prVar10 = &PTR__runtime_error_00357118;
        __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      to_expression_abi_cxx11_(&local_90,this,(pCVar14->combined_id).id,true);
      plVar9 = (long *)::std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70);
      goto LAB_001c905b;
    }
LAB_001c8dc6:
    samp_id.id = (int)((ulong)((long)pPVar19 - (long)pPVar3) >> 2) * -0x33333333;
    bVar15 = false;
  }
  else {
    image_id.id = (int)((ulong)((long)pPVar12 - (long)pPVar3) >> 2) * -0x33333333;
    if (pPVar19 != pPVar1) goto LAB_001c8dc6;
    bVar15 = true;
  }
  bVar22 = pPVar12 == pPVar1;
  pSVar2 = (this->super_Compiler).current_function;
  pCVar4 = (pSVar2->combined_parameters).
           super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.ptr;
  sVar16 = (pSVar2->combined_parameters).
           super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.buffer_size;
  pCVar13 = pCVar4;
  uVar17 = sVar16;
  if (0 < (long)sVar16 >> 2) {
    lVar6 = ((long)sVar16 >> 2) + 1;
    pCVar13 = pCVar4 + 2;
    do {
      if ((((pCVar13[-2].global_image == bVar22) && (pCVar13[-2].global_sampler == bVar15)) &&
          (pCVar13[-2].image_id.id == image_id.id)) && (pCVar13[-2].sampler_id.id == samp_id.id)) {
        pCVar13 = pCVar13 + -2;
        goto LAB_001c9027;
      }
      if (((pCVar13[-1].global_image == bVar22) && (pCVar13[-1].global_sampler == bVar15)) &&
         ((pCVar13[-1].image_id.id == image_id.id && (pCVar13[-1].sampler_id.id == samp_id.id)))) {
        pCVar13 = pCVar13 + -1;
        goto LAB_001c9027;
      }
      if (((pCVar13->global_image == bVar22) && (pCVar13->global_sampler == bVar15)) &&
         (((pCVar13->image_id).id == image_id.id && ((pCVar13->sampler_id).id == samp_id.id))))
      goto LAB_001c9027;
      if ((((pCVar13[1].global_image == bVar22) && (pCVar13[1].global_sampler == bVar15)) &&
          (pCVar13[1].image_id.id == image_id.id)) && (pCVar13[1].sampler_id.id == samp_id.id)) {
        pCVar13 = pCVar13 + 1;
        goto LAB_001c9027;
      }
      lVar6 = lVar6 + -1;
      pCVar13 = pCVar13 + 4;
    } while (1 < lVar6);
    pCVar13 = (CombinedImageSamplerParameter *)
              ((long)&(pCVar4->id).id + (sVar16 * 0x10 & 0xffffffffffffffc0));
    uVar17 = (ulong)((uint)sVar16 & 3);
  }
  if (uVar17 == 1) {
LAB_001c8ef4:
    if ((((pCVar13->global_image != bVar22) || (pCVar13->global_sampler != bVar15)) ||
        ((pCVar13->image_id).id != image_id.id)) || ((pCVar13->sampler_id).id != samp_id.id))
    goto LAB_001c9132;
  }
  else if (uVar17 == 2) {
LAB_001c8ed5:
    if (((pCVar13->global_image != bVar22) || (pCVar13->global_sampler != bVar15)) ||
       (((pCVar13->image_id).id != image_id.id || ((pCVar13->sampler_id).id != samp_id.id)))) {
      pCVar13 = pCVar13 + 1;
      goto LAB_001c8ef4;
    }
  }
  else {
    if (uVar17 != 3) goto LAB_001c9132;
    if (((pCVar13->global_image != bVar22) || (pCVar13->global_sampler != bVar15)) ||
       (((pCVar13->image_id).id != image_id.id || ((pCVar13->sampler_id).id != samp_id.id)))) {
      pCVar13 = pCVar13 + 1;
      goto LAB_001c8ed5;
    }
  }
LAB_001c9027:
  if (pCVar13 != pCVar4 + sVar16) {
    to_expression_abi_cxx11_(&local_90,this,(pCVar13->id).id,true);
    plVar9 = (long *)::std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70);
LAB_001c905b:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar11 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar11) {
      lVar6 = plVar9[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar6;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar9;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    }
    __return_storage_ptr__->_M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    return __return_storage_ptr__;
  }
LAB_001c9132:
  prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "Cannot find mapping for combined sampler parameter, was build_combined_image_samplers() used before compile() was called?"
             ,"");
  ::std::runtime_error::runtime_error(prVar10,(string *)&local_90);
  *(undefined ***)prVar10 = &PTR__runtime_error_00357118;
  __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string CompilerGLSL::to_combined_image_sampler(VariableID image_id, VariableID samp_id)
{
	// Keep track of the array indices we have used to load the image.
	// We'll need to use the same array index into the combined image sampler array.
	auto image_expr = to_expression(image_id);
	string array_expr;
	auto array_index = image_expr.find_first_of('[');
	if (array_index != string::npos)
		array_expr = image_expr.substr(array_index, string::npos);

	auto &args = current_function->arguments;

	// For GLSL and ESSL targets, we must enumerate all possible combinations for sampler2D(texture2D, sampler) and redirect
	// all possible combinations into new sampler2D uniforms.
	auto *image = maybe_get_backing_variable(image_id);
	auto *samp = maybe_get_backing_variable(samp_id);
	if (image)
		image_id = image->self;
	if (samp)
		samp_id = samp->self;

	auto image_itr = find_if(begin(args), end(args),
	                         [image_id](const SPIRFunction::Parameter &param) { return image_id == param.id; });

	auto sampler_itr = find_if(begin(args), end(args),
	                           [samp_id](const SPIRFunction::Parameter &param) { return samp_id == param.id; });

	if (image_itr != end(args) || sampler_itr != end(args))
	{
		// If any parameter originates from a parameter, we will find it in our argument list.
		bool global_image = image_itr == end(args);
		bool global_sampler = sampler_itr == end(args);
		VariableID iid = global_image ? image_id : VariableID(uint32_t(image_itr - begin(args)));
		VariableID sid = global_sampler ? samp_id : VariableID(uint32_t(sampler_itr - begin(args)));

		auto &combined = current_function->combined_parameters;
		auto itr = find_if(begin(combined), end(combined), [=](const SPIRFunction::CombinedImageSamplerParameter &p) {
			return p.global_image == global_image && p.global_sampler == global_sampler && p.image_id == iid &&
			       p.sampler_id == sid;
		});

		if (itr != end(combined))
			return to_expression(itr->id) + array_expr;
		else
		{
			SPIRV_CROSS_THROW("Cannot find mapping for combined sampler parameter, was "
			                  "build_combined_image_samplers() used "
			                  "before compile() was called?");
		}
	}
	else
	{
		// For global sampler2D, look directly at the global remapping table.
		auto &mapping = combined_image_samplers;
		auto itr = find_if(begin(mapping), end(mapping), [image_id, samp_id](const CombinedImageSampler &combined) {
			return combined.image_id == image_id && combined.sampler_id == samp_id;
		});

		if (itr != end(combined_image_samplers))
			return to_expression(itr->combined_id) + array_expr;
		else
		{
			SPIRV_CROSS_THROW("Cannot find mapping for combined sampler, was build_combined_image_samplers() used "
			                  "before compile() was called?");
		}
	}
}